

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriterTests.cpp
# Opt level: O0

bool anon_unknown.dwarf_101329::IsCorrectMetadata<MILBlob::Fp8E4M3FN>
               (string *filePath,uint64_t offset,uint64_t entryCount,BlobDataType dataType)

{
  bool local_69;
  undefined1 local_68 [8];
  blob_metadata metadata;
  BlobDataType dataType_local;
  uint64_t entryCount_local;
  uint64_t offset_local;
  string *filePath_local;
  
  metadata.reserved_4._4_4_ = dataType;
  MILBlob::Blob::blob_metadata::blob_metadata((blob_metadata *)local_68);
  MILBlob::TestUtil::ReadData<MILBlob::Blob::blob_metadata>
            (filePath,(blob_metadata *)local_68,offset);
  local_69 = false;
  if (((local_68._0_4_ == 0xdeadbeef) &&
      (local_69 = false, local_68._4_4_ == metadata.reserved_4._4_4_)) &&
     (local_69 = false, metadata._0_8_ == entryCount)) {
    local_69 = (metadata.sizeInBytes & 0x3f) == 0;
  }
  return local_69;
}

Assistant:

[[nodiscard]] bool IsCorrectMetadata(const std::string& filePath,
                                     uint64_t offset,
                                     uint64_t entryCount,
                                     BlobDataType dataType)
{
    if constexpr (MILBlob::IsSubByteSized<T>::value) {
        return IsCorrectMetadataForSubByte<T>(filePath, offset, entryCount, dataType);
    } else {
        blob_metadata metadata;
        TestUtil::ReadData<blob_metadata>(filePath, metadata, offset);

        return metadata.sentinel == BlobMetadataSentinel && metadata.mil_dtype == dataType &&
               metadata.sizeInBytes == entryCount * sizeof(T) && metadata.offset % DefaultStorageAlignment == 0;
    }
}